

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

void __thiscall LineSpecialTable::LineSpecialTable(LineSpecialTable *this)

{
  int iVar1;
  FLineSpecial **ppFVar2;
  long lVar3;
  int iVar4;
  uint amount;
  
  (this->LineSpecialsInfo).Array = (FLineSpecial **)0x0;
  (this->LineSpecialsInfo).Most = 0;
  (this->LineSpecialsInfo).Count = 0;
  iVar4 = 0;
  lVar3 = 8;
  do {
    iVar1 = *(int *)((long)&LineSpecialNames[0].name + lVar3);
    if (iVar4 < iVar1) {
      iVar4 = iVar1;
    }
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xf78);
  amount = iVar4 + 1;
  TArray<FLineSpecial_*,_FLineSpecial_*>::Grow(&this->LineSpecialsInfo,amount);
  (this->LineSpecialsInfo).Count = amount;
  lVar3 = 0;
  do {
    (this->LineSpecialsInfo).Array[lVar3] = (FLineSpecial *)0x0;
    lVar3 = lVar3 + 1;
  } while (amount != (uint)lVar3);
  qsort(LineSpecialNames,0xf7,0x10,lscmp);
  lVar3 = 0;
  do {
    iVar4 = *(int *)((long)&LineSpecialNames[0].number + lVar3);
    ppFVar2 = (this->LineSpecialsInfo).Array;
    if (ppFVar2[iVar4] != (FLineSpecial *)0x0) {
      __assert_fail("LineSpecialsInfo[LineSpecialNames[i].number] == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_lnspec.cpp"
                    ,0xe2e,"LineSpecialTable::LineSpecialTable()");
    }
    ppFVar2[iVar4] = (FLineSpecial *)((long)&LineSpecialNames[0].name + lVar3);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0xf70);
  return;
}

Assistant:

LineSpecialTable()
	{
		unsigned int max = 0;
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			if (LineSpecialNames[i].number > (int)max)
				max = LineSpecialNames[i].number;
		}
		LineSpecialsInfo.Resize(max + 1);
		for (unsigned i = 0; i <= max; i++)
		{
			LineSpecialsInfo[i] = NULL;
		}

		qsort(LineSpecialNames, countof(LineSpecialNames), sizeof(FLineSpecial), lscmp);
		for (size_t i = 0; i < countof(LineSpecialNames); ++i)
		{
			assert(LineSpecialsInfo[LineSpecialNames[i].number] == NULL);
			LineSpecialsInfo[LineSpecialNames[i].number] = &LineSpecialNames[i];
		}
	}